

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic.h
# Opt level: O0

Orphan<capnp::DynamicList> * __thiscall
capnp::Orphanage::newOrphanCopy<capnp::DynamicList::Reader>
          (Orphan<capnp::DynamicList> *__return_storage_ptr__,Orphanage *this,Reader copyFrom)

{
  OrphanBuilder local_48;
  Type local_28;
  Orphanage *local_18;
  Orphanage *this_local;
  
  local_18 = this;
  this_local = (Orphanage *)__return_storage_ptr__;
  local_28 = (Type)DynamicList::Reader::getSchema(&copyFrom);
  capnp::_::OrphanBuilder::copy
            (&local_48,(EVP_PKEY_CTX *)this->arena,(EVP_PKEY_CTX *)this->capTable);
  Orphan<capnp::DynamicList>::Orphan(__return_storage_ptr__,(ListSchema)local_28,&local_48);
  capnp::_::OrphanBuilder::~OrphanBuilder(&local_48);
  return __return_storage_ptr__;
}

Assistant:

inline Orphan<DynamicList> Orphanage::newOrphanCopy<DynamicList::Reader>(
    DynamicList::Reader copyFrom) const {
  return Orphan<DynamicList>(copyFrom.getSchema(),
      _::OrphanBuilder::copy(arena, capTable, copyFrom.reader));
}